

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void insert_suite::fail_u32string(void)

{
  basic_variable<std::allocator<char>_> *local_878;
  basic_variable<std::allocator<char>_> *local_860;
  basic_variable<std::allocator<char>_> *local_848;
  basic_variable<std::allocator<char>_> *local_830;
  basic_variable<std::allocator<char>_> *local_818;
  basic_variable<std::allocator<char>_> *local_7a0;
  error *ex_5;
  iterator local_730;
  iterator local_718;
  const_iterator local_700 [3];
  error *ex_4;
  iterator local_6a0;
  undefined1 local_681;
  basic_variable<std::allocator<char>_> *local_680;
  basic_variable<std::allocator<char>_> local_678;
  basic_variable<std::allocator<char>_> local_648;
  undefined1 auStack_618 [32];
  basic_variable<std::allocator<char>_> local_5f8;
  basic_variable<std::allocator<char>_> local_5c8;
  undefined1 auStack_598 [32];
  basic_variable<std::allocator<char>_> local_578;
  basic_variable<std::allocator<char>_> local_548;
  undefined1 auStack_518 [32];
  basic_variable<std::allocator<char>_> local_4f8;
  basic_variable<std::allocator<char>_> local_4c8;
  undefined1 auStack_498 [32];
  basic_variable<std::allocator<char>_> local_478;
  basic_variable<std::allocator<char>_> local_448;
  basic_variable<std::allocator<char>_> local_418;
  basic_variable<std::allocator<char>_> local_3e8;
  undefined1 local_3b8 [24];
  variable map;
  error *ex_3;
  iterator local_328;
  iterator local_310;
  const_iterator local_2f8 [3];
  error *ex_2;
  iterator local_298;
  basic_variable<std::allocator<char>_> *local_280;
  basic_variable<std::allocator<char>_> local_278;
  basic_variable<std::allocator<char>_> local_248;
  basic_variable<std::allocator<char>_> local_218;
  basic_variable<std::allocator<char>_> local_1e8;
  undefined1 local_1b8 [24];
  variable array;
  error *ex_1;
  iterator local_110;
  const_iterator local_f8;
  iterator local_e0 [3];
  error *ex;
  basic_variable<std::allocator<char>_> local_88;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_88,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("data.insert(true)","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x22a,"void insert_suite::fail_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_110,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (&local_f8,&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&ex_1,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::insert
            (local_e0,(basic_variable<std::allocator<char>_> *)local_38,&local_f8,
             (basic_variable<std::allocator<char>_> *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&ex_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_110);
  trial::protocol::core::detail::throw_failed_impl
            ("data.insert(data.begin(), true)","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x22d,"void insert_suite::fail_u32string()");
  local_280 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_280,true);
  local_280 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_280,2);
  local_280 = &local_218;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_280,3.0);
  local_280 = &local_1e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_280,"alpha");
  local_1b8._0_8_ = &local_278;
  local_1b8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_1b8);
  local_7a0 = (basic_variable<std::allocator<char>_> *)local_1b8;
  do {
    local_7a0 = local_7a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_7a0);
  } while (local_7a0 != &local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_298,(basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&ex_2,(basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>>::
  insert<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((basic_variable<std::allocator<char>> *)local_38,&local_298,(iterator *)&ex_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&ex_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_298);
  trial::protocol::core::detail::throw_failed_impl
            ("data.insert(array.begin(), array.end())","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x232,"void insert_suite::fail_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_310,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (local_2f8,&local_310);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_328,(basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&ex_3,(basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>>::
  insert<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((basic_variable<std::allocator<char>> *)local_38,local_2f8,&local_328,(iterator *)&ex_3
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&ex_3);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_310);
  trial::protocol::core::detail::throw_failed_impl
            ("data.insert(data.end(), array.begin(), array.end())","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x235,"void insert_suite::fail_u32string()");
  local_681 = 1;
  auStack_498._24_8_ = &local_478;
  auStack_518._24_8_ = &local_4f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_518._24_8_,"alpha");
  auStack_518._24_8_ = &local_4c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)auStack_518._24_8_,true);
  auStack_498._8_8_ = &local_4f8;
  auStack_498._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_478,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_498 + 8));
  auStack_598._24_8_ = &local_578;
  auStack_498._24_8_ = &local_448;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_598._24_8_,"bravo");
  auStack_598._24_8_ = &local_548;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)auStack_598._24_8_,2);
  auStack_518._8_8_ = &local_578;
  auStack_518._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_448,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_518 + 8));
  auStack_618._24_8_ = &local_5f8;
  auStack_498._24_8_ = &local_418;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_618._24_8_,"charlie");
  auStack_618._24_8_ = &local_5c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)auStack_618._24_8_,3.0);
  auStack_598._8_8_ = &local_5f8;
  auStack_598._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_418,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_598 + 8));
  local_680 = &local_678;
  auStack_498._24_8_ = &local_3e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_680,"delta");
  local_680 = &local_648;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_680,"hydrogen");
  auStack_618._8_8_ = &local_678;
  auStack_618._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_3e8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_618 + 8));
  local_681 = 0;
  local_3b8._0_8_ = &local_478;
  local_3b8._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3b8 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_3b8);
  local_818 = (basic_variable<std::allocator<char>_> *)local_3b8;
  do {
    local_818 = local_818 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_818);
  } while (local_818 != &local_478);
  local_830 = (basic_variable<std::allocator<char>_> *)auStack_618;
  do {
    local_830 = local_830 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_830);
  } while (local_830 != &local_678);
  local_848 = (basic_variable<std::allocator<char>_> *)auStack_598;
  do {
    local_848 = local_848 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_848);
  } while (local_848 != &local_5f8);
  local_860 = (basic_variable<std::allocator<char>_> *)auStack_518;
  do {
    local_860 = local_860 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_860);
  } while (local_860 != &local_578);
  local_878 = (basic_variable<std::allocator<char>_> *)auStack_498;
  do {
    local_878 = local_878 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_878);
  } while (local_878 != &local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6a0,(basic_variable<std::allocator<char>_> *)(local_3b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&ex_4,(basic_variable<std::allocator<char>_> *)(local_3b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>>::
  insert<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((basic_variable<std::allocator<char>> *)local_38,&local_6a0,(iterator *)&ex_4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&ex_4);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a0);
  trial::protocol::core::detail::throw_failed_impl
            ("data.insert(map.begin(), map.end())","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x240,"void insert_suite::fail_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_718,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::const_iterator
            (local_700,&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_730,(basic_variable<std::allocator<char>_> *)(local_3b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)&ex_5,(basic_variable<std::allocator<char>_> *)(local_3b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>>::
  insert<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((basic_variable<std::allocator<char>> *)local_38,local_700,&local_730,(iterator *)&ex_5
            );
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)&ex_5);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_730);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(local_700);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_718);
  trial::protocol::core::detail::throw_failed_impl
            ("data.insert(data.end(), map.begin(), map.end())","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x243,"void insert_suite::fail_u32string()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_3b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void fail_u32string()
{
    variable data(U"delta");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.insert(true),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.insert(data.begin(), true),
                                    error,
                                    "incompatible type");

    variable array = { true, 2, 3.0, "alpha" };
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.insert(array.begin(), array.end()),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.insert(data.end(), array.begin(), array.end()),
                                    error,
                                    "incompatible type");

    variable map =
        {
            { "alpha", true },
            { "bravo", 2 },
            { "charlie", 3.0 },
            { "delta", "hydrogen" }
        };
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.insert(map.begin(), map.end()),
                                    error,
                                    "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.insert(data.end(), map.begin(), map.end()),
                                    error,
                                    "incompatible type");
}